

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0x9ed,"unaligned bigints");
  }
  iVar4 = compare(this,other);
  if (-1 < iVar4) {
    iVar4 = other->exp_ - this->exp_;
    sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
    if (sVar1 == 0) {
      uVar5 = 0;
    }
    else {
      puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar7 = 0;
      lVar8 = 0;
      do {
        lVar6 = (ulong)puVar3[(long)iVar4 + sVar7] + (lVar8 - (ulong)puVar2[sVar7]);
        puVar3[(long)iVar4 + sVar7] = (uint)lVar6;
        lVar8 = lVar6 >> 0x3f;
        sVar7 = sVar7 + 1;
      } while (sVar1 != sVar7);
      uVar5 = (uint)((ulong)lVar6 >> 0x3f);
      iVar4 = iVar4 + (int)sVar7;
    }
    if ((uVar5 != 0) &&
       (puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_,
       lVar8 = (ulong)puVar2[iVar4] - (ulong)uVar5, puVar2[iVar4] = (uint)lVar8, lVar8 < 0)) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                  ,0x9f4,"");
    }
    remove_leading_zeros(this);
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
              ,0x9ee,"");
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }